

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdvancedMath.hpp
# Opt level: O0

bool Diligent::CheckLineSectionOverlap<true,unsigned_int>(uint Min0,uint Max0,uint Min1,uint Max1)

{
  Char *Message;
  undefined4 in_register_0000000c;
  bool local_51;
  undefined1 local_38 [8];
  string msg;
  uint Max1_local;
  uint Min1_local;
  uint Max0_local;
  uint Min0_local;
  
  msg.field_2._8_4_ = Max1;
  msg.field_2._12_4_ = Min1;
  if ((Max0 < Min0) || (Max1 < Min1)) {
    FormatString<char[26],char[29]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Min0 <= Max0 && Min1 <= Max1",
               (char (*) [29])CONCAT44(in_register_0000000c,Max1));
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"CheckLineSectionOverlap",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/AdvancedMath.hpp"
               ,0x4c6);
    std::__cxx11::string::~string((string *)local_38);
  }
  local_51 = (uint)msg.field_2._8_4_ < Min0 || Max0 < (uint)msg.field_2._12_4_;
  return (bool)((local_51 ^ 0xffU) & 1);
}

Assistant:

bool CheckLineSectionOverlap(T Min0, T Max0, T Min1, T Max1)
{
    VERIFY_EXPR(Min0 <= Max0 && Min1 <= Max1);
    //     [------]         [------]
    //   Min0    Max0    Min1     Max1
    //
    //     [------]         [------]
    //   Min1    Max1    Min0     Max0
    if (AllowTouch)
    {
        return !(Min0 > Max1 || Min1 > Max0);
    }
    else
    {
        return !(Min0 >= Max1 || Min1 >= Max0);
    }
}